

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O2

bool __thiscall
ylt::metric::
dynamic_metric_impl<ylt::metric::detail::summary_impl<unsigned_int,_6UL>,_(unsigned_char)'\x02'>::
my_equal::operator()
          (my_equal *this,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *s1,span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *s2)

{
  ulong uVar1;
  __type_conflict2 _Var2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 0;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 2) break;
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(s1->_M_ptr->_M_dataplus)._M_p + lVar4),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(s2->_M_ptr->_M_dataplus)._M_p + lVar4));
    lVar4 = lVar4 + 0x20;
    uVar1 = uVar3 + 1;
  } while (_Var2);
  return 1 < uVar3;
}

Assistant:

bool operator()(const std::span<const std::string, N>& s1,
                    const std::span<const std::string, N>& s2) const noexcept {
      if constexpr (N > 0) {
        for (int i = 0; i < N; ++i) {
          if (s1[i] != s2[i]) {
            return false;
          }
        }
      }
      return true;
    }